

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
SmallArray<SynBinaryOpElement,_32U>::SmallArray
          (SmallArray<SynBinaryOpElement,_32U> *this,Allocator *allocator)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = 0x28;
  do {
    *(undefined8 *)((long)this->little + lVar2 + -0x10) = 0;
    *(undefined4 *)((long)this->little + lVar2 + -0x18) = 0;
    puVar1 = (undefined8 *)((long)this->little + lVar2 + -0x28);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x428);
  this->allocator = allocator;
  this->data = this->little;
  this->count = 0;
  this->max = 0x20;
  return;
}

Assistant:

SmallArray(Allocator *allocator = 0): allocator(allocator)
	{
		data = little;
		max = N;

		count = 0;
	}